

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeCTRAW.cpp
# Opt level: O0

int __thiscall
FormatTypeCTRAW::LoadDisk
          (FormatTypeCTRAW *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  int iVar1;
  IDisk *this_00;
  undefined1 local_f8 [8];
  CAPSFile caps_file;
  ILoadingProgress *loading_progress_local;
  IDisk **created_disk_local;
  size_t size_local;
  uchar *buffer_local;
  FormatTypeCTRAW *this_local;
  
  if (*(int *)buffer == 0x53504143) {
    caps_file.list_tracks_.
    super__Vector_base<CAPSFile::Trackchunk,_std::allocator<CAPSFile::Trackchunk>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)loading_progress;
    CAPSFile::CAPSFile((CAPSFile *)local_f8);
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    *created_disk = this_00;
    created_disk_local._0_4_ = (uint)size;
    iVar1 = CAPSFile::ReadBuffer
                      ((CAPSFile *)local_f8,buffer,(uint)created_disk_local,*created_disk,
                       (ILoadingProgress *)
                       caps_file.list_tracks_.
                       super__Vector_base<CAPSFile::Trackchunk,_std::allocator<CAPSFile::Trackchunk>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      if (*created_disk != (IDisk *)0x0) {
        (*(*created_disk)->_vptr_IDisk[1])();
      }
      *created_disk = (IDisk *)0x0;
      this_local._4_4_ = -1;
    }
    CAPSFile::~CAPSFile((CAPSFile *)local_f8);
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int FormatTypeCTRAW::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                              ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "CAPS", 4) == 0)
   {
      CAPSFile caps_file;
      created_disk = new IDisk();
      if (caps_file.ReadBuffer(buffer, size, created_disk, loading_progress) == 0)
      {
         return OK;
      }
      else
      {
         delete created_disk;
         created_disk = nullptr;
         return FILE_ERROR;
      }
   }
   else
   {
      return FILE_ERROR;
   }
}